

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O0

void nni_id_map_init(nni_id_map *m,uint64_t lo,uint64_t hi,_Bool randomize)

{
  uint64_t uStack_20;
  _Bool randomize_local;
  uint64_t hi_local;
  uint64_t lo_local;
  nni_id_map *m_local;
  
  hi_local = lo;
  if (lo == 0) {
    hi_local = 1;
  }
  uStack_20 = hi;
  if (hi == 0) {
    uStack_20 = 0xffffffff;
  }
  if (hi_local == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c",
              0x23,"lo != 0");
  }
  if (uStack_20 <= hi_local) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c",
              0x24,"hi > lo");
  }
  m->id_entries = (nni_id_entry *)0x0;
  m->id_count = 0;
  m->id_load = 0;
  m->id_cap = 0;
  m->id_dyn_val = 0;
  m->id_max_load = 0;
  m->id_min_load = 0;
  m->id_min_val = hi_local;
  m->id_max_val = uStack_20;
  if (randomize) {
    m->id_flags = 2;
  }
  else {
    m->id_flags = 0;
  }
  return;
}

Assistant:

void
nni_id_map_init(nni_id_map *m, uint64_t lo, uint64_t hi, bool randomize)
{
	if (lo == 0) {
		lo = 1;
	}
	if (hi == 0) {
		hi = 0xffffffffu;
	}
	NNI_ASSERT(lo != 0);
	NNI_ASSERT(hi > lo);
	m->id_entries  = NULL;
	m->id_count    = 0;
	m->id_load     = 0;
	m->id_cap      = 0;
	m->id_dyn_val  = 0;
	m->id_max_load = 0;
	m->id_min_load = 0; // never shrink below this
	m->id_min_val  = lo;
	m->id_max_val  = hi;
	if (randomize) {
		m->id_flags = NNI_ID_FLAG_RANDOM;
	} else {
		m->id_flags = 0;
	}
}